

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.cc
# Opt level: O0

Result __thiscall
wabt::MemoryStream::WriteDataImpl(MemoryStream *this,size_t dst_offset,void *src,size_t size)

{
  pointer pOVar1;
  size_type sVar2;
  reference __dest;
  uint8_t *dst;
  size_t end;
  size_t size_local;
  void *src_local;
  size_t dst_offset_local;
  MemoryStream *this_local;
  
  if (size == 0) {
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  else {
    pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator->(&this->buf_);
    sVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&pOVar1->data);
    if (sVar2 < dst_offset + size) {
      pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
               operator->(&this->buf_);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
                (&pOVar1->data,dst_offset + size);
    }
    pOVar1 = std::unique_ptr<wabt::OutputBuffer,_std::default_delete<wabt::OutputBuffer>_>::
             operator->(&this->buf_);
    __dest = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                       (&pOVar1->data,dst_offset);
    memcpy(__dest,src,size);
    Result::Result((Result *)((long)&this_local + 4),Ok);
  }
  return (Result)this_local._4_4_;
}

Assistant:

Result MemoryStream::WriteDataImpl(size_t dst_offset,
                                   const void* src,
                                   size_t size) {
  if (size == 0) {
    return Result::Ok;
  }
  size_t end = dst_offset + size;
  if (end > buf_->data.size()) {
    buf_->data.resize(end);
  }
  uint8_t* dst = &buf_->data[dst_offset];
  memcpy(dst, src, size);
  return Result::Ok;
}